

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_utils.c
# Opt level: O2

int QuantizeLevels(uint8_t *data,int width,int height,int num_levels,uint64_t *sse)

{
  double *pdVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  int q_level [256];
  int freq [256];
  double inv_q_level [256];
  double q_sum [256];
  double q_count [256];
  
  iVar9 = 0;
  memset(freq,0,0x400);
  memset(q_level,0,0x400);
  memset(inv_q_level,0,0x800);
  if ((data != (uint8_t *)0x0) && (0xffffff00 < num_levels - 0x101U && (0 < height && 0 < width))) {
    iVar13 = height * width;
    lVar12 = (long)iVar13;
    auVar17._8_4_ = iVar13 >> 0x1f;
    auVar17._0_8_ = lVar12;
    auVar17._12_4_ = 0x45300000;
    uVar6 = 0xff;
    iVar9 = 0;
    uVar8 = 0;
    for (lVar11 = 0; uVar5 = (uint)uVar6, lVar12 != lVar11; lVar11 = lVar11 + 1) {
      bVar2 = data[lVar11];
      uVar10 = (ulong)bVar2;
      iVar9 = iVar9 + (uint)(freq[uVar10] == 0);
      if (bVar2 <= uVar5) {
        uVar6 = uVar10;
      }
      if (uVar8 <= bVar2) {
        uVar8 = (uint)bVar2;
      }
      freq[uVar10] = freq[uVar10] + 1;
    }
    if (num_levels < iVar9) {
      uVar15 = num_levels - 1;
      for (uVar10 = 0; (uint)num_levels != uVar10; uVar10 = uVar10 + 1) {
        inv_q_level[uVar10] =
             ((double)(int)uVar10 * (double)(int)(uVar8 - uVar5)) / (double)(int)uVar15 +
             (double)uVar5;
      }
      q_level[uVar6] = 0;
      uVar10 = (ulong)uVar8;
      q_level[uVar10] = uVar15;
      iVar9 = 0;
      dVar16 = 0.0;
      dVar18 = 1e+38;
      do {
        if (iVar9 == 6) break;
        uVar8 = 0;
        memset(q_sum,0,0x800);
        memset(q_count,0,0x800);
        for (uVar7 = uVar6; uVar7 <= uVar10; uVar7 = uVar7 + 1) {
          lVar11 = (long)(int)uVar8;
          uVar5 = uVar15;
          if ((int)uVar15 < (int)uVar8) {
            uVar5 = uVar8;
          }
          uVar14 = uVar8 - 1;
          do {
            uVar8 = uVar5;
            if ((int)uVar15 <= lVar11) break;
            pdVar1 = inv_q_level + lVar11;
            lVar4 = lVar11 + 1;
            lVar11 = lVar11 + 1;
            uVar14 = uVar14 + 1;
            uVar8 = uVar14;
          } while (*pdVar1 + inv_q_level[lVar4] < (double)((int)uVar7 * 2));
          iVar3 = freq[uVar7];
          if (0 < iVar3) {
            q_sum[(int)uVar8] = (double)((int)uVar7 * iVar3) + q_sum[(int)uVar8];
            q_count[(int)uVar8] = (double)iVar3 + q_count[(int)uVar8];
          }
          q_level[uVar7] = uVar8;
        }
        if (2 < num_levels) {
          for (uVar7 = 1; uVar15 != uVar7; uVar7 = uVar7 + 1) {
            if (0.0 < q_count[uVar7]) {
              inv_q_level[uVar7] = q_sum[uVar7] / q_count[uVar7];
            }
          }
        }
        dVar16 = 0.0;
        for (uVar7 = uVar6; uVar7 <= uVar10; uVar7 = uVar7 + 1) {
          dVar19 = (double)(int)uVar7 - inv_q_level[q_level[uVar7]];
          dVar16 = dVar16 + (double)freq[uVar7] * dVar19 * dVar19;
        }
        dVar19 = dVar18 - dVar16;
        iVar9 = iVar9 + 1;
        dVar18 = dVar16;
      } while (((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,iVar13) - 4503599627370496.0)) * 0.0001 <= dVar19);
      for (; uVar6 <= uVar10; uVar6 = uVar6 + 1) {
        *(char *)((long)q_sum + uVar6) = (char)(int)(inv_q_level[q_level[uVar6]] + 0.5);
      }
      for (lVar11 = 0; lVar12 != lVar11; lVar11 = lVar11 + 1) {
        data[lVar11] = *(uint8_t *)((long)q_sum + (ulong)data[lVar11]);
      }
      uVar6 = (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16;
    }
    else {
      uVar6 = 0;
    }
    iVar9 = 1;
    if (sse != (uint64_t *)0x0) {
      *sse = uVar6;
    }
  }
  return iVar9;
}

Assistant:

int QuantizeLevels(uint8_t* const data, int width, int height,
                   int num_levels, uint64_t* const sse) {
  int freq[NUM_SYMBOLS] = { 0 };
  int q_level[NUM_SYMBOLS] = { 0 };
  double inv_q_level[NUM_SYMBOLS] = { 0 };
  int min_s = 255, max_s = 0;
  const size_t data_size = height * width;
  int i, num_levels_in, iter;
  double last_err = 1.e38, err = 0.;
  const double err_threshold = ERROR_THRESHOLD * data_size;

  if (data == NULL) {
    return 0;
  }

  if (width <= 0 || height <= 0) {
    return 0;
  }

  if (num_levels < 2 || num_levels > 256) {
    return 0;
  }

  {
    size_t n;
    num_levels_in = 0;
    for (n = 0; n < data_size; ++n) {
      num_levels_in += (freq[data[n]] == 0);
      if (min_s > data[n]) min_s = data[n];
      if (max_s < data[n]) max_s = data[n];
      ++freq[data[n]];
    }
  }

  if (num_levels_in <= num_levels) goto End;  // nothing to do!

  // Start with uniformly spread centroids.
  for (i = 0; i < num_levels; ++i) {
    inv_q_level[i] = min_s + (double)(max_s - min_s) * i / (num_levels - 1);
  }

  // Fixed values. Won't be changed.
  q_level[min_s] = 0;
  q_level[max_s] = num_levels - 1;
  assert(inv_q_level[0] == min_s);
  assert(inv_q_level[num_levels - 1] == max_s);

  // k-Means iterations.
  for (iter = 0; iter < MAX_ITER; ++iter) {
    double q_sum[NUM_SYMBOLS] = { 0 };
    double q_count[NUM_SYMBOLS] = { 0 };
    int s, slot = 0;

    // Assign classes to representatives.
    for (s = min_s; s <= max_s; ++s) {
      // Keep track of the nearest neighbour 'slot'
      while (slot < num_levels - 1 &&
             2 * s > inv_q_level[slot] + inv_q_level[slot + 1]) {
        ++slot;
      }
      if (freq[s] > 0) {
        q_sum[slot] += s * freq[s];
        q_count[slot] += freq[s];
      }
      q_level[s] = slot;
    }

    // Assign new representatives to classes.
    if (num_levels > 2) {
      for (slot = 1; slot < num_levels - 1; ++slot) {
        const double count = q_count[slot];
        if (count > 0.) {
          inv_q_level[slot] = q_sum[slot] / count;
        }
      }
    }

    // Compute convergence error.
    err = 0.;
    for (s = min_s; s <= max_s; ++s) {
      const double error = s - inv_q_level[q_level[s]];
      err += freq[s] * error * error;
    }

    // Check for convergence: we stop as soon as the error is no
    // longer improving.
    if (last_err - err < err_threshold) break;
    last_err = err;
  }

  // Remap the alpha plane to quantized values.
  {
    // double->int rounding operation can be costly, so we do it
    // once for all before remapping. We also perform the data[] -> slot
    // mapping, while at it (avoid one indirection in the final loop).
    uint8_t map[NUM_SYMBOLS];
    int s;
    size_t n;
    for (s = min_s; s <= max_s; ++s) {
      const int slot = q_level[s];
      map[s] = (uint8_t)(inv_q_level[slot] + .5);
    }
    // Final pass.
    for (n = 0; n < data_size; ++n) {
      data[n] = map[data[n]];
    }
  }
 End:
  // Store sum of squared error if needed.
  if (sse != NULL) *sse = (uint64_t)err;

  return 1;
}